

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

Qiniu_Error Qiniu_Client_CallNoRet(Qiniu_Client *self,char *url)

{
  CURL *curl_00;
  Qiniu_Error QVar1;
  undefined4 uStack_64;
  undefined4 uStack_54;
  undefined4 uStack_44;
  CURL *curl;
  Qiniu_Header *headers;
  char *url_local;
  Qiniu_Client *self_local;
  Qiniu_Error err;
  
  curl = (CURL *)0x0;
  headers = (Qiniu_Header *)url;
  url_local = (char *)self;
  curl_00 = Qiniu_Client_initcall(self,url);
  QVar1 = Qiniu_Client_config((Qiniu_Client *)url_local);
  err._0_8_ = QVar1.message;
  self_local = (Qiniu_Client *)CONCAT44(uStack_44,QVar1.code);
  if (QVar1.code == 200) {
    if (*(long *)(url_local + 0x10) != 0) {
      QVar1 = Qiniu_Do_Auth((Qiniu_Client *)url_local,"POST",(Qiniu_Header **)&curl,(char *)headers,
                            (char *)0x0,0);
      err._0_8_ = QVar1.message;
      self_local = (Qiniu_Client *)CONCAT44(uStack_54,QVar1.code);
      if (QVar1.code != 200) goto LAB_00134b4d;
    }
    curl_easy_setopt(curl_00,0x2727,curl);
    QVar1 = Qiniu_callex(curl_00,(Qiniu_Buffer *)(url_local + 0x20),
                         (Qiniu_Json **)(url_local + 0x18),0,(Qiniu_Buffer *)(url_local + 0x38));
    err._0_8_ = QVar1.message;
    self_local = (Qiniu_Client *)CONCAT44(uStack_64,QVar1.code);
    curl_slist_free_all(curl);
  }
LAB_00134b4d:
  QVar1._0_8_ = (ulong)self_local & 0xffffffff;
  QVar1.message = (char *)err._0_8_;
  return QVar1;
}

Assistant:

Qiniu_Error Qiniu_Client_CallNoRet(Qiniu_Client *self, const char *url)
{
    Qiniu_Error err;
    Qiniu_Header *headers = NULL;
    CURL *curl = Qiniu_Client_initcall(self, url);
    err = Qiniu_Client_config(self);
    if (err.code != 200)
    {
        return err;
    }

    if (self->auth.itbl != NULL)
    {
        err = Qiniu_Do_Auth(self, "POST", &headers, url, NULL, 0);
        if (err.code != 200)
        {
            return err;
        }
    }

    curl_easy_setopt(curl, CURLOPT_HTTPHEADER, headers);
    err = Qiniu_callex(curl, &self->b, &self->root, Qiniu_False, &self->respHeader);
    curl_slist_free_all(headers);
    return err;
}